

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O0

MPP_RET hal_jpege_vepu511_deinit(void *hal)

{
  JpegeV511HalContext *ctx;
  void *hal_local;
  
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","(%d) enter\n","hal_jpege_vepu511_deinit",0x60);
  }
  jpege_bits_deinit(*(JpegeBits *)((long)hal + 0x100));
  if (*(long *)((long)hal + 0x70) != 0) {
    mpp_osal_free("hal_jpege_vepu511_deinit",*(void **)((long)hal + 0x70));
  }
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (*(long *)((long)hal + 0x78) != 0) {
    mpp_osal_free("hal_jpege_vepu511_deinit",*(void **)((long)hal + 0x78));
  }
  *(undefined8 *)((long)hal + 0x78) = 0;
  if (*(long *)((long)hal + 0xd8) != 0) {
    mpp_osal_free("hal_jpege_vepu511_deinit",*(void **)((long)hal + 0xd8));
  }
  *(undefined8 *)((long)hal + 0xd8) = 0;
  if (*(long *)((long)hal + 0x68) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","(%d) leave\n","hal_jpege_vepu511_deinit",0x6b);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu511_deinit(void *hal)
{
    JpegeV511HalContext *ctx = (JpegeV511HalContext *)hal;

    hal_jpege_enter();
    jpege_bits_deinit(ctx->bits);

    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->reg_out);
    MPP_FREE(ctx->input_fmt);

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }
    hal_jpege_leave();
    return MPP_OK;
}